

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O1

void __thiscall
xLearn::Trainer::train
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *train_reader,
          vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *test_reader)

{
  pointer *ppMVar1;
  Metric *pMVar2;
  iterator __position;
  bool bVar3;
  index_t iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  MetricInfo *pMVar8;
  ostream *poVar9;
  real_t rVar10;
  float time_cost;
  undefined1 auVar11 [64];
  MetricInfo te_info;
  string metric_type;
  Modifier reset;
  Modifier bold;
  Modifier green;
  float local_a0;
  float local_9c;
  MetricInfo local_98;
  index_t local_90;
  int local_8c;
  Timer local_88;
  undefined1 local_78 [16];
  real_t local_68;
  real_t local_64;
  real_t local_60;
  Modifier local_5c;
  Modifier local_58;
  Modifier local_54;
  string local_50;
  undefined1 extraout_var [56];
  
  if (this->metric_ == (Metric *)0x0) {
    local_9c = 1.1754944e-38;
    local_a0 = 3.4028235e+38;
    goto LAB_00137857;
  }
  (*this->metric_->_vptr_Metric[5])(&local_88);
  iVar5 = std::__cxx11::string::compare((char *)&local_88);
  local_9c = 3.4028235e+38;
  local_a0 = 1.1754944e-38;
  if ((((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_88), iVar5 != 0)) &&
      (iVar5 = std::__cxx11::string::compare((char *)&local_88), iVar5 != 0)) &&
     ((iVar5 = std::__cxx11::string::compare((char *)&local_88), iVar5 != 0 &&
      (iVar5 = std::__cxx11::string::compare((char *)&local_88), iVar5 != 0)))) {
    iVar5 = std::__cxx11::string::compare((char *)&local_88);
    if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_88), iVar5 != 0)) {
      iVar5 = std::__cxx11::string::compare((char *)&local_88);
      local_a0 = 0.0;
      local_9c = 0.0;
      if (iVar5 != 0) goto LAB_00137826;
    }
    local_9c = 1.1754944e-38;
    local_a0 = 3.4028235e+38;
  }
LAB_00137826:
  if (local_88.begin.__d.__r != (duration)local_78) {
    operator_delete((void *)local_88.begin.__d.__r);
  }
LAB_00137857:
  if (this->quiet_ == false) {
    show_head_info(this,(test_reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_start !=
                        (test_reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish);
  }
  if (this->epoch_ < 1) {
    local_90 = 0;
  }
  else {
    iVar5 = 0;
    local_90 = 0;
    local_8c = 0;
    do {
      Timer::Timer(&local_88);
      Timer::tic(&local_88);
      rVar10 = calc_gradient(this,train_reader);
      bVar3 = true;
      if (this->quiet_ == false) {
        local_60 = rVar10;
        if ((test_reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (test_reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          auVar11._0_8_ = calc_metric(this,test_reader);
          auVar11._8_56_ = extraout_var;
          local_98 = (MetricInfo)vmovlps_avx(auVar11._0_16_);
        }
        local_64 = local_98.loss_val;
        local_68 = local_98.metric_val;
        time_cost = Timer::toc(&local_88);
        show_train_info(this,local_60,local_64,local_68,time_cost,
                        (test_reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_start !=
                        (test_reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish,iVar5 + 1U);
        if (this->early_stop_ == true) {
          pMVar2 = this->metric_;
          if (((pMVar2 == (Metric *)0x0) && (local_98.loss_val <= local_a0)) ||
             ((pMVar2 != (Metric *)0x0 &&
              (iVar6 = (*pMVar2->_vptr_Metric[6])((ulong)local_98 >> 0x20,(ulong)(uint)local_a0),
              (char)iVar6 != '\0')))) {
            pMVar8 = &local_98;
            if (this->metric_ != (Metric *)0x0) {
              pMVar8 = (MetricInfo *)&local_98.metric_val;
            }
            local_a0 = pMVar8->loss_val;
            Model::SetBestModel(this->model_);
            local_90 = iVar5 + 1U;
          }
          pMVar2 = this->metric_;
          if (((pMVar2 == (Metric *)0x0) && (local_9c < local_98.loss_val)) ||
             ((iVar6 = 0, pMVar2 != (Metric *)0x0 &&
              (iVar7 = (*pMVar2->_vptr_Metric[6])((ulong)local_98 >> 0x20,(ulong)(uint)local_9c),
              (char)iVar7 == '\0')))) {
            if (local_8c == this->stop_window_) {
              bVar3 = false;
              goto LAB_00137a02;
            }
            iVar6 = local_8c + 1;
          }
          pMVar8 = &local_98;
          if (this->metric_ != (Metric *)0x0) {
            pMVar8 = (MetricInfo *)&local_98.metric_val;
          }
          local_9c = pMVar8->loss_val;
          local_8c = iVar6;
        }
      }
LAB_00137a02:
    } while ((bVar3) && (iVar5 = iVar5 + 1, iVar5 < this->epoch_));
  }
  iVar4 = local_90;
  if ((this->early_stop_ == true) && (local_90 != this->epoch_)) {
    if (this->metric_ == (Metric *)0x0) {
      local_88.begin.__d.__r = (duration)local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"loss","");
    }
    else {
      (*this->metric_->_vptr_Metric[5])(&local_88);
    }
    StringPrintf_abi_cxx11_
              (&local_50,"Early-stopping at epoch %d, best %s: %f",(double)local_a0,(ulong)iVar4,
               local_88.begin.__d.__r);
    local_54.code = FG_GREEN;
    local_58.code = BOLD;
    local_5c.code = RESET;
    poVar9 = Color::operator<<((ostream *)&std::cout,&local_54);
    poVar9 = Color::operator<<(poVar9,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[ ACTION     ] ",0xf);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_50._M_dataplus._M_p,local_50._M_string_length);
    poVar9 = Color::operator<<(poVar9,&local_5c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    Model::Shrink(this->model_);
    if (local_88.begin.__d.__r != (duration)local_78) {
      operator_delete((void *)local_88.begin.__d.__r);
    }
  }
  else {
    __position._M_current =
         (this->metric_info_).
         super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->metric_info_).
        super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<xLearn::MetricInfo,std::allocator<xLearn::MetricInfo>>::
      _M_realloc_insert<xLearn::MetricInfo_const&>
                ((vector<xLearn::MetricInfo,std::allocator<xLearn::MetricInfo>> *)
                 &this->metric_info_,__position,&local_98);
    }
    else {
      *__position._M_current = local_98;
      ppMVar1 = &(this->metric_info_).
                 super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
  }
  return;
}

Assistant:

void Trainer::train(std::vector<Reader*>& train_reader,
                    std::vector<Reader*>& test_reader) {
  int best_epoch = 0;
  int stop_window = 0;
  real_t best_result = 0;
  real_t prev_result = 0;
  if (metric_ == nullptr) {
    best_result = kFloatMax;
    prev_result = kFloatMin;
  } else {
    std::string metric_type = metric_->metric_type();
    // Classification
    if (metric_type.compare("Accuracy") == 0 ||
        metric_type.compare("Precision") == 0 ||
        metric_type.compare("Recall") == 0 ||
        metric_type.compare("F1") == 0 ||
        metric_type.compare("AUC") == 0) {
      best_result = kFloatMin;
      prev_result = kFloatMax;
    } else if (metric_type.compare("MAE") == 0 ||
               metric_type.compare("MAPE") == 0 ||
               metric_type.compare("RMSD") == 0) {  // regression
      best_result = kFloatMax;
      prev_result = kFloatMin;
    }
  }
  MetricInfo te_info;
  // Show header info
  if (!quiet_) { 
    show_head_info(!test_reader.empty()); 
  }
  for (int n = 1; n <= epoch_; ++n) {
    Timer timer;
    timer.tic();
    // Calc grad and update model
    real_t tr_loss = calc_gradient(train_reader);
    // we don't do any evaluation in a quiet model
    if (!quiet_) {
      if (!test_reader.empty()) { 
        te_info = calc_metric(test_reader); 
      }
      // show evaluation metric info
      show_train_info(tr_loss, 
                      te_info.loss_val,
                      te_info.metric_val,
                      timer.toc(), 
                      !test_reader.empty(), 
                      n);
      // Early-stopping
      if (early_stop_) {
        if ((metric_ == nullptr && te_info.loss_val <= best_result) ||
            (metric_ != nullptr && metric_->cmp(te_info.metric_val, 
                                                best_result))) {
          best_result = metric_ == nullptr ? 
            te_info.loss_val : te_info.metric_val;
          best_epoch = n;
          model_->SetBestModel();
        }
        if ((metric_ == nullptr && te_info.loss_val > prev_result) ||
            (metric_ != nullptr && !metric_->cmp(te_info.metric_val, 
                                                 prev_result))) {
          // If the validation loss goes up continuously
          // in stop_window epoch, we stop training
          if (stop_window == stop_window_) { break; }
          stop_window++;
        } else {
          stop_window = 0;
        }
        prev_result = metric_ == nullptr ? 
          te_info.loss_val : te_info.metric_val;
      }
    }
  }
  if (early_stop_ && best_epoch != epoch_) {  // not for cv
    std::string metric_name = metric_ == nullptr ? 
      "loss" : metric_->metric_type();
    Color::print_action(
      StringPrintf("Early-stopping at epoch %d, best %s: %f", 
        best_epoch, metric_name.c_str(), best_result)
    );
    model_->Shrink();
  } else {  // for cv
    metric_info_.push_back(te_info);
  }
}